

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O1

int __thiscall
highs::CacheMinRbTree<HighsNodeQueue::NodeLowerRbTree>::link
          (CacheMinRbTree<HighsNodeQueue::NodeLowerRbTree> *this,char *__from,char *__to)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  if ((char *)*this->first_ != __to) goto LAB_002d28bb;
  if (__to != (char *)0xffffffffffffffff) {
    lVar3 = this[1].super_RbTree<HighsNodeQueue::NodeLowerRbTree>.rootNode[1];
    lVar5 = (long)(int)__from * 0x90;
    dVar1 = *(double *)(lVar3 + 0x48 + lVar5);
    lVar6 = (long)(int)__to * 0x90;
    dVar2 = *(double *)(lVar3 + 0x48 + lVar6);
    if (dVar2 <= dVar1) {
      if (dVar2 < dVar1) goto LAB_002d28bb;
      iVar4 = (int)((ulong)(*(long *)(lVar3 + 8 + lVar5) - *(long *)(lVar3 + lVar5)) >> 4);
      iVar7 = (int)((ulong)(*(long *)(lVar3 + 8 + lVar6) - *(long *)(lVar3 + lVar6)) >> 4);
      if (iVar7 <= iVar4) {
        if (iVar7 < iVar4) goto LAB_002d28bb;
        dVar1 = *(double *)(lVar3 + 0x50 + lVar5);
        dVar2 = *(double *)(lVar3 + 0x50 + lVar6);
        if ((dVar2 <= dVar1) && (((long)(int)__to <= (long)(int)__from || (dVar2 < dVar1))))
        goto LAB_002d28bb;
      }
    }
  }
  *this->first_ = (LinkType)__from;
LAB_002d28bb:
  iVar4 = RbTree<HighsNodeQueue::NodeLowerRbTree>::link
                    (&this->super_RbTree<HighsNodeQueue::NodeLowerRbTree>,__from,__to);
  return iVar4;
}

Assistant:

void link(LinkType z, LinkType parent) {
    if (first_ == parent) {
      if (parent == RbTreeLinks<LinkType>::noLink() ||
          static_cast<const Impl*>(this)->getKey(z) <
              static_cast<const Impl*>(this)->getKey(parent))
        first_ = z;
    }

    RbTree<Impl>::link(z, parent);
  }